

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::dispose
          (ArrayBuilder<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *this)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *pOVar1;
  RemoveConst<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *pRVar2;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *pOVar3;
  
  pOVar1 = this->ptr;
  if (pOVar1 != (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0) {
    pRVar2 = this->pos;
    pOVar3 = this->endPtr;
    this->endPtr = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0;
    this->ptr = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0;
    this->pos = (RemoveConst<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pOVar1,8,(long)pRVar2 - (long)pOVar1 >> 3,
               (long)pOVar3 - (long)pOVar1 >> 3,
               ArrayDisposer::Dispose_<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::
               destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }